

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

void FILEUnixToDosPathA(LPSTR lpPath)

{
  char *local_18;
  LPSTR p;
  LPSTR lpPath_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  local_18 = lpPath;
  if (lpPath != (LPSTR)0x0) {
    for (; *local_18 != '\0'; local_18 = local_18 + 1) {
      if (*local_18 == '/') {
        *local_18 = '\\';
      }
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  return;
}

Assistant:

void
FILEUnixToDosPathA(
       LPSTR lpPath)
{
    LPSTR p;

    TRACE("Original Unix path = [%s]\n", lpPath);

    if (!lpPath)
        return;

    for (p = lpPath; *p; p++)
    {
        if (*p == '/')
            *p = '\\';
    }

    TRACE("Resulting DOS path = [%s]\n", lpPath);
}